

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::iterate(SharedRenderingPerfCase *this)

{
  bool bVar1;
  TestLog *log;
  deUint64 dVar2;
  size_type sVar3;
  value_type_conflict5 local_58;
  undefined4 local_50;
  undefined1 local_40 [8];
  vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  threads;
  deUint64 endTimeUs;
  deUint64 beginTimeUs;
  SharedRenderingPerfCase *this_local;
  
  std::
  vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
            *)local_40);
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->m_results);
  if (bVar1) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    anon_unknown_5::logTestConfig(log,&this->m_config);
  }
  anon_unknown_5::createThreads
            ((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
              *)local_40,(this->m_config).threadCount,(this->m_config).perThreadContextCount,
             &this->m_contexts);
  dVar2 = deGetMicroseconds();
  anon_unknown_5::startThreads
            ((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
              *)local_40);
  anon_unknown_5::joinThreads
            ((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
              *)local_40);
  threads.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)deGetMicroseconds();
  bVar1 = anon_unknown_5::threadResultsOk
                    ((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                      *)local_40);
  if (bVar1) {
    anon_unknown_5::destroyThreads
              ((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                *)local_40);
    local_58 = (long)threads.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - dVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_results,&local_58);
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_results);
    if ((int)sVar3 == this->m_iterationCount) {
      anon_unknown_5::logAndSetResults
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,&this->m_results);
      this_local._4_4_ = STOP;
    }
    else {
      this_local._4_4_ = CONTINUE;
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    this_local._4_4_ = STOP;
  }
  local_50 = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
             *)local_40);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult SharedRenderingPerfCase::iterate (void)
{
	deUint64			beginTimeUs;
	deUint64			endTimeUs;
	vector<TestThread*>	threads;

	if (m_results.empty())
		logTestConfig(m_testCtx.getLog(), m_config);

	createThreads(threads, m_config.threadCount, m_config.perThreadContextCount, m_contexts);

	beginTimeUs = deGetMicroseconds();

	startThreads(threads);
	joinThreads(threads);

	endTimeUs = deGetMicroseconds();

	if (!threadResultsOk(threads))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	destroyThreads(threads);

	m_results.push_back(endTimeUs - beginTimeUs);

	if ((int)m_results.size() == m_iterationCount)
	{
		logAndSetResults(m_testCtx, m_results);
		return STOP;
	}
	else
		return CONTINUE;
}